

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_2::SampleCoverageCase::test(SampleCoverageCase *this)

{
  CallLogWrapper *this_00;
  GLfloat GVar1;
  deBool dVar2;
  int iVar3;
  int ndx;
  ulong uVar4;
  long lVar5;
  GLfloat *pGVar6;
  GLfloat GVar7;
  float fVar8;
  Random rnd;
  deRandom local_38;
  
  deRandom_init(&local_38,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[2])
            (0x3f800000,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80aa);
  lVar5 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  do {
    GVar1 = *(GLfloat *)((long)&DAT_00b3a170 + lVar5);
    glu::CallLogWrapper::glSampleCoverage(this_00,GVar1,'\0');
    (*this->m_verifier->_vptr_StateVerifier[2])
              (GVar1,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80aa);
    ApiCase::expectError(&this->super_ApiCase,0);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x10);
  pGVar6 = (GLfloat *)&DAT_00b3a180;
  uVar4 = 0;
  do {
    GVar1 = *pGVar6;
    glu::CallLogWrapper::glSampleCoverage(this_00,GVar1,'\0');
    GVar7 = 0.0;
    if (1 < uVar4) {
      GVar7 = 1.0;
      if (GVar1 <= 1.0) {
        GVar7 = GVar1;
      }
    }
    (*this->m_verifier->_vptr_StateVerifier[2])
              (GVar7,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80aa);
    ApiCase::expectError(&this->super_ApiCase,0);
    uVar4 = uVar4 + 1;
    pGVar6 = pGVar6 + 1;
  } while (uVar4 != 4);
  iVar3 = 0x78;
  do {
    fVar8 = deRandom_getFloat(&local_38);
    dVar2 = deRandom_getBool(&local_38);
    glu::CallLogWrapper::glSampleCoverage(this_00,fVar8 + 0.0,dVar2 == 1);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (fVar8 + 0.0,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80aa);
    ApiCase::expectError(&this->super_ApiCase,0);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, 1.0f);
		expectError(GL_NO_ERROR);

		{
			const float fixedTests[] =
			{
				0.0f, 0.5f, 0.45f, 0.55f
			};
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fixedTests); ++ndx)
			{
				glSampleCoverage(fixedTests[ndx], GL_FALSE);
				m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, fixedTests[ndx]);
				expectError(GL_NO_ERROR);
			}
		}

		{
			const float clampTests[] =
			{
				-1.0f, -1.5f, 1.45f, 3.55f
			};
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(clampTests); ++ndx)
			{
				glSampleCoverage(clampTests[ndx], GL_FALSE);
				m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, de::clamp(clampTests[ndx], 0.0f, 1.0f));
				expectError(GL_NO_ERROR);
			}
		}

		{
			const int numIterations = 120;
			for (int i = 0; i < numIterations; ++i)
			{
				GLfloat		reference	= rnd.getFloat(0, 1);
				GLboolean	invert		= rnd.getBool() ? GL_TRUE : GL_FALSE;

				glSampleCoverage(reference, invert);
				m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, reference);
				expectError(GL_NO_ERROR);
			}
		}
	}